

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O0

UINT8 device_start_ym2413_nuked(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData;
  UINT32 local_2c;
  UINT32 rate;
  opll_t *chip;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  local_2c = cfg->clock / 0x48;
  if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (local_2c < cfg->smplRate)))) {
    local_2c = cfg->smplRate;
  }
  devData.chipInf = calloc(1,0x8200);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    *(UINT32 *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf = cfg->clock;
    *(UINT32 *)((long)devData.chipInf + 0xc) = local_2c;
    *(uint *)&((DEV_DATA *)((long)devData.chipInf + 0x10))->chipInf = (uint)((cfg->flags & 1) != 0);
    nukedopll_set_mute_mask(devData.chipInf,0);
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,local_2c,&devDef_YM2413_Nuked);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_ym2413_nuked(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	opll_t* chip;
	UINT32 rate;
	
	rate = cfg->clock / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = (opll_t*)calloc(1, sizeof(opll_t));
	if (chip == NULL)
		return 0xFF;
	
	chip->clock = cfg->clock;
	chip->smplRate = rate; // save for reset
	chip->chip_type = (cfg->flags & 0x01) ? opll_type_ds1001 : opll_type_ym2413;
	nukedopll_set_mute_mask(chip, 0x00);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, rate, &devDef_YM2413_Nuked);
	return 0x00;
}